

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yocto_obj.h
# Opt level: O1

yo__vert * yo__parse_vert(yo__vert *__return_storage_ptr__,char *str,yo__vhash *vhash,yo__vert vl)

{
  yo__vert *pyVar1;
  int iVar2;
  int iVar3;
  yo__vert *pyVar4;
  yo__vert *pyVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  int *piVar11;
  size_t __size;
  ulong uVar12;
  int i;
  long lVar13;
  char *splits [5];
  yo__vert local_68;
  char *local_48 [5];
  
  pyVar5 = &local_68;
  local_48[1] = (char *)0x0;
  local_48[2] = (char *)0x0;
  local_48[3] = (char *)0x0;
  local_48[4] = (char *)0x0;
  local_48[0] = str;
  local_68.pos = -1;
  local_68.texcoord = -1;
  local_68.norm = -1;
  local_68.color = -1;
  local_68.radius = -1;
  local_68.vid = 0;
  pcVar10 = str + 1;
  iVar3 = 1;
  do {
    if (pcVar10[-1] == '/') {
      pcVar10[-1] = '\0';
      if (iVar3 < 5) {
        lVar13 = (long)iVar3;
        iVar3 = iVar3 + 1;
        local_48[lVar13] = pcVar10;
      }
    }
    else if (pcVar10[-1] == '\0') break;
    pcVar10 = pcVar10 + 1;
  } while( true );
  lVar13 = 0;
  do {
    if (local_48[lVar13] == (char *)0x0) {
      (&local_68.pos)[lVar13] = -1;
    }
    else {
      iVar3 = atoi(local_48[lVar13]);
      (&local_68.pos)[lVar13] = iVar3;
      if (iVar3 < 0) {
        iVar3 = iVar3 + *(int *)((long)splits + lVar13 * 4 + -0x18);
      }
      else {
        iVar3 = iVar3 + -1;
      }
      (&local_68.pos)[lVar13] = iVar3;
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 5);
  iVar3 = local_68.pos % 0x100000;
  uVar8 = vhash->s[iVar3];
  if ((long)(int)uVar8 < 1) {
    uVar6 = 0xffffffff;
  }
  else {
    piVar11 = &vhash->v[iVar3]->radius;
    uVar9 = 0xffffffff;
    uVar12 = 0;
    do {
      if ((((local_68.pos == ((yo__vert *)(piVar11 + -4))->pos) &&
           (local_68.texcoord == piVar11[-3])) && (local_68.norm == piVar11[-2])) &&
         ((local_68.color == piVar11[-1] && (local_68.radius == *piVar11)))) {
        uVar9 = uVar12 & 0xffffffff;
      }
      uVar6 = (uint)uVar9;
      uVar12 = uVar12 + 1;
    } while ((uVar12 < (ulong)(long)(int)uVar8) && (piVar11 = piVar11 + 6, (int)uVar6 < 0));
  }
  if (-1 < (int)uVar6) {
    pyVar5 = vhash->v[iVar3] + uVar6;
    goto LAB_00170f54;
  }
  local_68.vid = vhash->nverts;
  if (uVar8 == 0xffffffff) {
    iVar7 = 0;
LAB_00170eb0:
    uVar6 = uVar8 - 1 >> 1 | uVar8 - 1;
    uVar6 = uVar6 >> 2 | uVar6;
    uVar6 = uVar6 >> 4 | uVar6;
    uVar6 = uVar6 >> 8 | uVar6;
    if ((int)((uVar6 >> 0x10 | uVar6) + 1) < iVar7) goto LAB_00170edb;
  }
  else {
    if (uVar8 != 0) {
      uVar6 = uVar8 >> 1 | uVar8;
      uVar6 = uVar6 >> 2 | uVar6;
      uVar6 = uVar6 >> 4 | uVar6;
      uVar6 = uVar6 >> 8 | uVar6;
      iVar7 = (uVar6 >> 0x10 | uVar6) + 1;
      goto LAB_00170eb0;
    }
LAB_00170edb:
    if (uVar8 == 0xffffffff) {
      __size = 0;
    }
    else {
      uVar8 = uVar8 >> 1 | uVar8;
      uVar8 = uVar8 >> 2 | uVar8;
      uVar8 = uVar8 >> 4 | uVar8;
      uVar8 = uVar8 >> 8 | uVar8;
      __size = (long)(int)((uVar8 >> 0x10 | uVar8) + 1) * 0x18;
    }
    pyVar4 = (yo__vert *)realloc(vhash->v[iVar3],__size);
    vhash->v[iVar3] = pyVar4;
  }
  pyVar4 = vhash->v[iVar3];
  iVar7 = vhash->s[iVar3];
  pyVar1 = pyVar4 + iVar7;
  pyVar1->radius = local_68.radius;
  pyVar1->vid = local_68.vid;
  pyVar4 = pyVar4 + iVar7;
  pyVar4->pos = local_68.pos;
  pyVar4->texcoord = local_68.texcoord;
  pyVar4->norm = local_68.norm;
  pyVar4->color = local_68.color;
  vhash->s[iVar3] = vhash->s[iVar3] + 1;
  vhash->nverts = vhash->nverts + 1;
LAB_00170f54:
  iVar3 = pyVar5->vid;
  __return_storage_ptr__->radius = pyVar5->radius;
  __return_storage_ptr__->vid = iVar3;
  iVar3 = pyVar5->texcoord;
  iVar7 = pyVar5->norm;
  iVar2 = pyVar5->color;
  __return_storage_ptr__->pos = pyVar5->pos;
  __return_storage_ptr__->texcoord = iVar3;
  __return_storage_ptr__->norm = iVar7;
  __return_storage_ptr__->color = iVar2;
  return __return_storage_ptr__;
}

Assistant:

static inline yo__vert
yo__parse_vert(char* str, yo__vhash* vhash, yo__vert vl) {
    // parse triplet
    char* splits[] = { str, 0, 0, 0, 0 };
    int ns = 1;
    yo__vert v = { -1, -1, -1, -1, -1 };
    while (*str) {
        if (*str == '/') {
            *str = 0;
            if (ns < 5) splits[ns++] = str + 1;
        }
        str++;
    }
    int* f = &v.pos;
    int* l = &vl.pos;
    for (int i = 0; i < 5; i++) {
        if (!splits[i]) {
            f[i] = -1;
            continue;
        }
        f[i] = (int)atoi(splits[i]);
        f[i] = (f[i] < 0) ? l[i] + f[i] : f[i] - 1;
    }

    // determine position vid using vertex hash
    int pos = -1;
    int hidx = v.pos % yo__vhash_size;
    for (int i = 0; i < vhash->s[hidx] && pos < 0; i++) {
        if (v.pos == vhash->v[hidx][i].pos &&
            v.texcoord == vhash->v[hidx][i].texcoord &&
            v.norm == vhash->v[hidx][i].norm &&
            v.color == vhash->v[hidx][i].color &&
            v.radius == vhash->v[hidx][i].radius)
            pos = i;
    }

    // found, can exit
    if (pos >= 0) return vhash->v[hidx][pos];

    // insert in vhash
    v.vid = vhash->nverts;
    yo__pushback(yo__vert, vhash->v[hidx], vhash->s[hidx], v);
    vhash->nverts++;

    return v;
}